

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O0

void __thiscall notch::pre::OneHotEncoder::countColumnValues(OneHotEncoder *this,Dataset *d)

{
  size_t this_00;
  bool bVar1;
  reference __v;
  reference piVar2;
  mapped_type *this_01;
  float *pfVar3;
  reference ppVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  double dVar7;
  allocator<int> local_161;
  _Rb_tree_const_iterator<int> local_160;
  _Rb_tree_const_iterator<int> local_158;
  vector<int,_std::allocator<int>_> local_150;
  undefined1 local_138 [8];
  set<int,_std::less<int>,_std::allocator<int>_> colVals;
  undefined1 local_100 [4];
  int colId_1;
  pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_> col;
  iterator __end2_1;
  iterator __begin2_1;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *__range2_1;
  int local_a0;
  int local_9c;
  iterator iStack_98;
  int colId;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  undefined1 local_70 [8];
  Array a;
  const_iterator __end2;
  const_iterator __begin2;
  Dataset *__range2;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  colMaps;
  Dataset *d_local;
  OneHotEncoder *this_local;
  
  colMaps._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)d;
  core::std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::map((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
         *)&__range2);
  this_00 = colMaps._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __end2 = core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::begin
                     ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)
                      colMaps._M_t._M_impl.super__Rb_tree_header._M_node_count);
  a._M_data = (float *)core::std::
                       vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::end
                                 ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
                                   *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::valarray<float>_*,_std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>_>
                                *)&a._M_data);
    if (!bVar1) break;
    __v = __gnu_cxx::
          __normal_iterator<const_std::valarray<float>_*,_std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>_>
          ::operator*(&__end2);
    core::std::valarray<float>::valarray((valarray<float> *)local_70,__v);
    __end3 = core::std::vector<int,_std::allocator<int>_>::begin(&this->inputColumns);
    iStack_98 = core::std::vector<int,_std::allocator<int>_>::end(&this->inputColumns);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffff68);
      if (!bVar1) break;
      piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end3);
      local_9c = *piVar2;
      this_01 = core::std::
                map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                ::operator[]((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                              *)&__range2,&local_9c);
      pfVar3 = core::std::valarray<float>::operator[]((valarray<float> *)local_70,(long)local_9c);
      dVar7 = core::std::round((double)(ulong)(uint)*pfVar3);
      local_a0 = (int)SUB84(dVar7,0);
      core::std::set<int,_std::less<int>,_std::allocator<int>_>::insert(this_01,&local_a0);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end3);
    }
    core::std::valarray<float>::~valarray((valarray<float> *)local_70);
    __gnu_cxx::
    __normal_iterator<const_std::valarray<float>_*,_std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>_>
    ::operator++(&__end2);
  }
  this->nExtraCols = 0;
  core::std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&this->columnValues);
  __end2_1 = core::std::
             map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             ::begin((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      *)&__range2);
  col.second._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)core::std::
               map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::end((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      *)&__range2);
  while( true ) {
    bVar1 = core::std::operator!=
                      (&__end2_1,
                       (_Self *)&col.second._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (!bVar1) break;
    ppVar4 = core::std::
             _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
             ::operator*(&__end2_1);
    core::std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>::pair
              ((pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)local_100,
               ppVar4);
    colVals._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (int)local_100;
    core::std::set<int,_std::less<int>,_std::allocator<int>_>::set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_138,
               (set<int,_std::less<int>,_std::allocator<int>_> *)&col);
    local_158._M_node =
         (_Base_ptr)
         core::std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)local_138);
    local_160._M_node =
         (_Base_ptr)
         core::std::set<int,_std::less<int>,_std::allocator<int>_>::end
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)local_138);
    core::std::allocator<int>::allocator(&local_161);
    std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
              ((vector<int,std::allocator<int>> *)&local_150,local_158,local_160,&local_161);
    pmVar5 = core::std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](&this->columnValues,
                          (key_type *)
                          ((long)&colVals._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
    core::std::vector<int,_std::allocator<int>_>::operator=(pmVar5,&local_150);
    core::std::vector<int,_std::allocator<int>_>::~vector(&local_150);
    core::std::allocator<int>::~allocator(&local_161);
    pmVar5 = core::std::
             map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::operator[](&this->columnValues,
                          (key_type *)
                          ((long)&colVals._M_t._M_impl.super__Rb_tree_header._M_node_count + 4));
    sVar6 = core::std::vector<int,_std::allocator<int>_>::size(pmVar5);
    this->nExtraCols = (sVar6 - 1) + this->nExtraCols;
    core::std::set<int,_std::less<int>,_std::allocator<int>_>::~set
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_138);
    core::std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>::~pair
              ((pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)local_100);
    core::std::
    _Rb_tree_iterator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>::
    operator++(&__end2_1);
  }
  core::std::
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~map((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          *)&__range2);
  return;
}

Assistant:

void countColumnValues(const Dataset &d) {
        std::map<int, std::set<int>> colMaps; // columnIndex -> {categories}
        for (Array a : d) {
            for (int colId : inputColumns) {
                colMaps[colId].insert(int(std::round(a[colId])));
            }
        }
        nExtraCols = 0;
        columnValues.clear();
        for (auto col : colMaps) {
            auto colId = col.first;
            auto colVals = col.second;
            columnValues[colId] = std::vector<int>(colVals.begin(), colVals.end());
            nExtraCols += columnValues[colId].size() - 1;
        }
    }